

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

int __thiscall DIntermissionScreenCast::Responder(DIntermissionScreenCast *this,event_t *ev)

{
  AActor *actor;
  bool bVar1;
  int iVar2;
  FState *pFVar3;
  FSoundID local_38;
  FSoundID local_34;
  FSoundID local_30;
  int local_2c;
  FName local_28;
  int snd;
  FName label [2];
  event_t *ev_local;
  DIntermissionScreenCast *this_local;
  
  if (ev->type == '\x01') {
    if ((this->castdeath & 1U) == 0) {
      this->castdeath = true;
      if (this->mClass != (PClassActor *)0x0) {
        label = (FName  [2])ev;
        FName::FName(&local_28,NAME_Death);
        FName::FName((FName *)&snd,NAME_Cast);
        pFVar3 = PClassActor::FindState(this->mClass,2,&local_28,false);
        this->caststate = pFVar3;
        if (this->caststate == (FState *)0x0) {
          return -1;
        }
        iVar2 = FState::GetTics(this->caststate);
        this->casttics = iVar2;
        this->castframes = 0;
        this->castattacking = false;
        bVar1 = PClass::IsDescendantOf
                          (&this->mClass->super_PClass,APlayerPawn::RegistrationInfo.MyClass);
        if (bVar1) {
          actor = (AActor *)(&players)[(long)consoleplayer * 0x54];
          FSoundID::FSoundID(&local_30,"*death");
          local_2c = S_FindSkinnedSound(actor,&local_30);
          if (local_2c != 0) {
            FSoundID::FSoundID(&local_34,local_2c);
            S_Sound(0x22,&local_34,1.0,0.0);
          }
        }
        else {
          iVar2 = FSoundID::operator_cast_to_int(&(this->mDefaults->DeathSound).super_FSoundID);
          if (iVar2 != 0) {
            FSoundID::FSoundID(&local_38,&(this->mDefaults->DeathSound).super_FSoundID);
            S_Sound(0x22,&local_38,1.0,0.0);
          }
        }
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int DIntermissionScreenCast::Responder (event_t *ev)
{
	if (ev->type != EV_KeyDown) return 0;

	if (castdeath)
		return 1;					// already in dying frames

	castdeath = true;

	if (mClass != NULL)
	{
		FName label[] = {NAME_Death, NAME_Cast};
		caststate = mClass->FindState(2, label);
		if (caststate == NULL) return -1;

		casttics = caststate->GetTics();
		castframes = 0;
		castattacking = false;

		if (mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
		{
			int snd = S_FindSkinnedSound(players[consoleplayer].mo, "*death");
			if (snd != 0) S_Sound (CHAN_VOICE | CHAN_UI, snd, 1, ATTN_NONE);
		}
		else if (mDefaults->DeathSound)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, mDefaults->DeathSound, 1, ATTN_NONE);
		}
	}
	return true;
}